

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleShape.h
# Opt level: O2

void __thiscall
cbtTriangleShape::cbtTriangleShape
          (cbtTriangleShape *this,cbtVector3 *p0,cbtVector3 *p1,cbtVector3 *p2)

{
  undefined8 uVar1;
  
  cbtPolyhedralConvexShape::cbtPolyhedralConvexShape(&this->super_cbtPolyhedralConvexShape);
  (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape._vptr_cbtCollisionShape =
       (_func_int **)&PTR__cbtPolyhedralConvexShape_01194600;
  (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape.m_shapeType = 1;
  uVar1 = *(undefined8 *)(p0->m_floats + 2);
  *(undefined8 *)this->m_vertices1[0].m_floats = *(undefined8 *)p0->m_floats;
  *(undefined8 *)(this->m_vertices1[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)(p1->m_floats + 2);
  *(undefined8 *)this->m_vertices1[1].m_floats = *(undefined8 *)p1->m_floats;
  *(undefined8 *)(this->m_vertices1[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)(p2->m_floats + 2);
  *(undefined8 *)this->m_vertices1[2].m_floats = *(undefined8 *)p2->m_floats;
  *(undefined8 *)(this->m_vertices1[2].m_floats + 2) = uVar1;
  return;
}

Assistant:

cbtTriangleShape(const cbtVector3& p0, const cbtVector3& p1, const cbtVector3& p2) : cbtPolyhedralConvexShape()
	{
		m_shapeType = TRIANGLE_SHAPE_PROXYTYPE;
		m_vertices1[0] = p0;
		m_vertices1[1] = p1;
		m_vertices1[2] = p2;
	}